

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns.c
# Opt level: O0

void PrintOutput(sunrealtype tfinal,N_Vector y,N_Vector yB,N_Vector qB)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  
  printf("--------------------------------------------------------\n");
  printf("returned t: %12.4e\n",in_XMM0_Qa);
  printf("lambda(t0): %12.4e %12.4e %12.4e\n",**(undefined8 **)(*in_RSI + 0x10),
         *(undefined8 *)(*(long *)(*in_RSI + 0x10) + 8),
         *(undefined8 *)(*(long *)(*in_RSI + 0x10) + 0x10));
  printf("y(t0):      %12.4e %12.4e %12.4e\n",**(undefined8 **)(*in_RDI + 0x10),
         *(undefined8 *)(*(long *)(*in_RDI + 0x10) + 8),
         *(undefined8 *)(*(long *)(*in_RDI + 0x10) + 0x10));
  printf("dG/dp:      %12.4e %12.4e %12.4e\n",**(ulong **)(*in_RDX + 0x10) ^ 0x8000000000000000,
         *(ulong *)(*(long *)(*in_RDX + 0x10) + 8) ^ 0x8000000000000000,
         *(ulong *)(*(long *)(*in_RDX + 0x10) + 0x10) ^ 0x8000000000000000);
  printf("--------------------------------------------------------\n");
  return;
}

Assistant:

static void PrintOutput(sunrealtype tfinal, N_Vector y, N_Vector yB, N_Vector qB)
{
  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("returned t: %12.4Le\n", tfinal);
  printf("lambda(t0): %12.4Le %12.4Le %12.4Le\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t0):      %12.4Le %12.4Le %12.4Le\n", Ith(y, 1), Ith(y, 2),
         Ith(y, 3));
  printf("dG/dp:      %12.4Le %12.4Le %12.4Le\n", -Ith(qB, 1), -Ith(qB, 2),
         -Ith(qB, 3));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("returned t: %12.4e\n", tfinal);
  printf("lambda(t0): %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t0):      %12.4e %12.4e %12.4e\n", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("dG/dp:      %12.4e %12.4e %12.4e\n", -Ith(qB, 1), -Ith(qB, 2),
         -Ith(qB, 3));
#else
  printf("returned t: %12.4e\n", tfinal);
  printf("lambda(t0): %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t0)     : %12.4e %12.4e %12.4e\n", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("dG/dp:      %12.4e %12.4e %12.4e\n", -Ith(qB, 1), -Ith(qB, 2),
         -Ith(qB, 3));
#endif
  printf("--------------------------------------------------------\n");
}